

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int viewGetColumnNames(Parse *pParse,Table *pTable)

{
  Select *pSVar1;
  Table *pTVar2;
  undefined8 *in_RSI;
  Parse *in_RDI;
  int nSelect;
  int nTab;
  u8 eParseMode;
  sqlite3_xauth xAuth;
  Table *in_stack_00000018;
  int rc;
  sqlite3 *db;
  ExprList *in_stack_00000028;
  int nErr;
  Select *pSel;
  Table *pSelTab;
  u16 uVar3;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar6;
  Table *pTable_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar7;
  sqlite3 *pParse_00;
  uint in_stack_ffffffffffffffd0;
  int local_4;
  
  local_4 = 0;
  pParse_00 = in_RDI->db;
  uVar7 = 0xaaaaaaaa;
  pTable_00 = (Table *)&DAT_aaaaaaaaaaaaaaaa;
  if (*(char *)((long)in_RSI + 0x3f) == '\x01') {
    pParse_00->nSchemaLock = pParse_00->nSchemaLock + 1;
    local_4 = sqlite3VtabCallConnect
                        ((Parse *)&DAT_aaaaaaaaaaaaaaaa,(Table *)(ulong)in_stack_ffffffffffffffd0);
    pParse_00->nSchemaLock = pParse_00->nSchemaLock - 1;
  }
  else if (*(short *)((long)in_RSI + 0x36) < 0) {
    sqlite3ErrorMsg(in_RDI,"view %s is circularly defined",*in_RSI);
    local_4 = 1;
  }
  else {
    pSVar1 = sqlite3SelectDup((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,(Select *)&DAT_aaaaaaaaaaaaaaaa,0);
    if (pSVar1 == (Select *)0x0) {
      local_4 = local_4 + 1;
    }
    else {
      uVar6 = CONCAT13(in_RDI->eParseMode,(int3)in_stack_ffffffffffffffb4);
      iVar5 = in_RDI->nTab;
      iVar4 = in_RDI->nSelect;
      in_RDI->eParseMode = '\0';
      sqlite3SrcListAssignCursors
                ((Parse *)CONCAT44(uVar7,in_stack_ffffffffffffffc0),(SrcList *)pTable_00);
      *(undefined2 *)((long)in_RSI + 0x36) = 0xffff;
      (pParse_00->lookaside).bDisable = (pParse_00->lookaside).bDisable + 1;
      (pParse_00->lookaside).sz = 0;
      pTable_00 = (Table *)pParse_00->xAuth;
      pParse_00->xAuth = (sqlite3_xauth)0x0;
      pTVar2 = sqlite3ResultSetOfSelect
                         ((Parse *)pParse_00,(Select *)CONCAT44(uVar7,in_stack_ffffffffffffffc0),
                          (char)((ulong)pTable_00 >> 0x38));
      pParse_00->xAuth = (sqlite3_xauth)pTable_00;
      in_RDI->nTab = iVar5;
      in_RDI->nSelect = iVar4;
      if (pTVar2 == (Table *)0x0) {
        *(undefined2 *)((long)in_RSI + 0x36) = 0;
        local_4 = local_4 + 1;
      }
      else if (in_RSI[4] == 0) {
        *(i16 *)((long)in_RSI + 0x36) = pTVar2->nCol;
        in_RSI[1] = pTVar2->aCol;
        *(u32 *)(in_RSI + 6) = pTVar2->tabFlags & 0x62 | *(uint *)(in_RSI + 6);
        pTVar2->nCol = 0;
        pTVar2->aCol = (Column *)0x0;
      }
      else {
        sqlite3ColumnsFromExprList
                  ((Parse *)pSel,in_stack_00000028,(i16 *)db,(Column **)in_stack_00000018);
        if ((in_RDI->nErr == 0) && ((int)*(short *)((long)in_RSI + 0x36) == pSVar1->pEList->nExpr))
        {
          sqlite3SubqueryColumnTypes((Parse *)db,in_stack_00000018,(Select *)xAuth,eParseMode);
        }
      }
      *(undefined2 *)(in_RSI + 7) = *(undefined2 *)((long)in_RSI + 0x36);
      sqlite3DeleteTable((sqlite3 *)CONCAT44(uVar6,iVar5),
                         (Table *)CONCAT44(iVar4,in_stack_ffffffffffffffa8));
      sqlite3SelectDelete((sqlite3 *)CONCAT44(uVar6,iVar5),
                          (Select *)CONCAT44(iVar4,in_stack_ffffffffffffffa8));
      (pParse_00->lookaside).bDisable = (pParse_00->lookaside).bDisable - 1;
      if ((pParse_00->lookaside).bDisable == 0) {
        uVar3 = (pParse_00->lookaside).szTrue;
      }
      else {
        uVar3 = 0;
      }
      (pParse_00->lookaside).sz = uVar3;
      in_RDI->eParseMode = (u8)((uint)uVar6 >> 0x18);
    }
    *(ushort *)(in_RSI[0xc] + 0x72) = *(ushort *)(in_RSI[0xc] + 0x72) | 2;
    if (pParse_00->mallocFailed != '\0') {
      sqlite3DeleteColumnNames((sqlite3 *)CONCAT44(uVar7,in_stack_ffffffffffffffc0),pTable_00);
    }
    local_4 = local_4 + in_RDI->nErr;
  }
  return local_4;
}

Assistant:

static SQLITE_NOINLINE int viewGetColumnNames(Parse *pParse, Table *pTable){
  Table *pSelTab;   /* A fake table from which we get the result set */
  Select *pSel;     /* Copy of the SELECT that implements the view */
  int nErr = 0;     /* Number of errors encountered */
  sqlite3 *db = pParse->db;  /* Database connection for malloc errors */
#ifndef SQLITE_OMIT_VIRTUALTABLE
  int rc;
#endif
#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth;       /* Saved xAuth pointer */
#endif

  assert( pTable );

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTable) ){
    db->nSchemaLock++;
    rc = sqlite3VtabCallConnect(pParse, pTable);
    db->nSchemaLock--;
    return rc;
  }
#endif

#ifndef SQLITE_OMIT_VIEW
  /* A positive nCol means the columns names for this view are
  ** already known.  This routine is not called unless either the
  ** table is virtual or nCol is zero.
  */
  assert( pTable->nCol<=0 );

  /* A negative nCol is a special marker meaning that we are currently
  ** trying to compute the column names.  If we enter this routine with
  ** a negative nCol, it means two or more views form a loop, like this:
  **
  **     CREATE VIEW one AS SELECT * FROM two;
  **     CREATE VIEW two AS SELECT * FROM one;
  **
  ** Actually, the error above is now caught prior to reaching this point.
  ** But the following test is still important as it does come up
  ** in the following:
  **
  **     CREATE TABLE main.ex1(a);
  **     CREATE TEMP VIEW ex1 AS SELECT a FROM ex1;
  **     SELECT * FROM temp.ex1;
  */
  if( pTable->nCol<0 ){
    sqlite3ErrorMsg(pParse, "view %s is circularly defined", pTable->zName);
    return 1;
  }
  assert( pTable->nCol>=0 );

  /* If we get this far, it means we need to compute the table names.
  ** Note that the call to sqlite3ResultSetOfSelect() will expand any
  ** "*" elements in the results set of the view and will assign cursors
  ** to the elements of the FROM clause.  But we do not want these changes
  ** to be permanent.  So the computation is done on a copy of the SELECT
  ** statement that defines the view.
  */
  assert( IsView(pTable) );
  pSel = sqlite3SelectDup(db, pTable->u.view.pSelect, 0);
  if( pSel ){
    u8 eParseMode = pParse->eParseMode;
    int nTab = pParse->nTab;
    int nSelect = pParse->nSelect;
    pParse->eParseMode = PARSE_MODE_NORMAL;
    sqlite3SrcListAssignCursors(pParse, pSel->pSrc);
    pTable->nCol = -1;
    DisableLookaside;
#ifndef SQLITE_OMIT_AUTHORIZATION
    xAuth = db->xAuth;
    db->xAuth = 0;
    pSelTab = sqlite3ResultSetOfSelect(pParse, pSel, SQLITE_AFF_NONE);
    db->xAuth = xAuth;
#else
    pSelTab = sqlite3ResultSetOfSelect(pParse, pSel, SQLITE_AFF_NONE);
#endif
    pParse->nTab = nTab;
    pParse->nSelect = nSelect;
    if( pSelTab==0 ){
      pTable->nCol = 0;
      nErr++;
    }else if( pTable->pCheck ){
      /* CREATE VIEW name(arglist) AS ...
      ** The names of the columns in the table are taken from
      ** arglist which is stored in pTable->pCheck.  The pCheck field
      ** normally holds CHECK constraints on an ordinary table, but for
      ** a VIEW it holds the list of column names.
      */
      sqlite3ColumnsFromExprList(pParse, pTable->pCheck,
                                 &pTable->nCol, &pTable->aCol);
      if( pParse->nErr==0
       && pTable->nCol==pSel->pEList->nExpr
      ){
        assert( db->mallocFailed==0 );
        sqlite3SubqueryColumnTypes(pParse, pTable, pSel, SQLITE_AFF_NONE);
      }
    }else{
      /* CREATE VIEW name AS...  without an argument list.  Construct
      ** the column names from the SELECT statement that defines the view.
      */
      assert( pTable->aCol==0 );
      pTable->nCol = pSelTab->nCol;
      pTable->aCol = pSelTab->aCol;
      pTable->tabFlags |= (pSelTab->tabFlags & COLFLAG_NOINSERT);
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      assert( sqlite3SchemaMutexHeld(db, 0, pTable->pSchema) );
    }
    pTable->nNVCol = pTable->nCol;
    sqlite3DeleteTable(db, pSelTab);
    sqlite3SelectDelete(db, pSel);
    EnableLookaside;
    pParse->eParseMode = eParseMode;
  } else {
    nErr++;
  }
  pTable->pSchema->schemaFlags |= DB_UnresetViews;
  if( db->mallocFailed ){
    sqlite3DeleteColumnNames(db, pTable);
  }
#endif /* SQLITE_OMIT_VIEW */
  return nErr + pParse->nErr;
}